

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_registrymanager.c
# Opt level: O3

IOTHUB_REGISTRYMANAGER_RESULT
IoTHubRegistryManager_UpdateDevice
          (IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle,
          IOTHUB_REGISTRY_DEVICE_UPDATE *deviceUpdate)

{
  IOTHUB_REGISTRYMANAGER_RESULT IVar1;
  LOGGER_LOG p_Var2;
  IOTHUB_REGISTRY_DEVICE_OR_MODULE_UPDATE local_48;
  
  if (registryManagerHandle == (IOTHUB_REGISTRYMANAGER_HANDLE)0x0 ||
      deviceUpdate == (IOTHUB_REGISTRY_DEVICE_UPDATE *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      IVar1 = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    else {
      IVar1 = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                ,"IoTHubRegistryManager_UpdateDevice",0x6c5,1,"Input parameter cannot be NULL");
    }
  }
  else {
    local_48.moduleId = (char *)0x0;
    local_48.managedBy = (char *)0x0;
    local_48.iotEdge_capable = false;
    local_48._41_7_ = 0;
    local_48.type = IOTHUB_REGISTRYMANAGER_MODEL_TYPE_DEVICE;
    local_48._4_4_ = 0;
    local_48.deviceId = deviceUpdate->deviceId;
    local_48.primaryKey = deviceUpdate->primaryKey;
    local_48.secondaryKey = deviceUpdate->secondaryKey;
    local_48.status = deviceUpdate->status;
    local_48.authMethod = deviceUpdate->authMethod;
    IVar1 = IoTHubRegistryManager_UpdateDeviceOrModule(registryManagerHandle,&local_48);
  }
  return IVar1;
}

Assistant:

IOTHUB_REGISTRYMANAGER_RESULT IoTHubRegistryManager_UpdateDevice(IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle, IOTHUB_REGISTRY_DEVICE_UPDATE* deviceUpdate)
{
    IOTHUB_REGISTRYMANAGER_RESULT result;

    if (registryManagerHandle == NULL || deviceUpdate == NULL)
    {
        LogError("Input parameter cannot be NULL");
        result = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    else
    {
        IOTHUB_REGISTRY_DEVICE_OR_MODULE_UPDATE deviceOrModuleUpdate;
        memset(&deviceOrModuleUpdate, 0, sizeof(deviceOrModuleUpdate));

        //Convert to generic update struct
        deviceOrModuleUpdate.type = IOTHUB_REGISTRYMANAGER_MODEL_TYPE_DEVICE;
        deviceOrModuleUpdate.deviceId = deviceUpdate->deviceId;
        deviceOrModuleUpdate.primaryKey = deviceUpdate->primaryKey;
        deviceOrModuleUpdate.secondaryKey = deviceUpdate->secondaryKey;
        deviceOrModuleUpdate.status = deviceUpdate->status;
        deviceOrModuleUpdate.authMethod = deviceUpdate->authMethod;
        deviceOrModuleUpdate.iotEdge_capable = false;   //IOTHUB_REGISTRY_DEVICE_UPDATE does not have this field, so set false

        result = IoTHubRegistryManager_UpdateDeviceOrModule(registryManagerHandle, &deviceOrModuleUpdate);
    }

    return result;
}